

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O3

void __thiscall
JsonParser_deserialize_string_Test::TestBody(JsonParser_deserialize_string_Test *this)

{
  bool bVar1;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> *extraout_RDX;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> *extraout_RDX_00;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> *extraout_RDX_01;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> *inout_read_view;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> *extraout_RDX_02;
  pointer *__ptr;
  char *pcVar2;
  u32string_view u32text;
  u16string_view u16text;
  u8string_view u8text;
  object obj;
  json_parser parser;
  long *local_d8;
  undefined1 local_d0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c8;
  undefined1 local_c0 [8];
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_b8;
  long local_b0 [2];
  undefined1 local_a0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  undefined1 local_90 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_88;
  AssertHelper local_80 [8];
  undefined1 local_78 [16];
  _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  local_68;
  code *local_20;
  
  local_20 = __cxa_guard_release;
  (*__M_insert<unsigned_long>)((object *)(local_78 + 0x10),&local_20,6,"\"text\"",0);
  testing::internal::CmpHelperEQ<jessilib::object,char8_t[5]>
            ((internal *)local_c0,"parser.deserialize(u8R\"json(\"text\")json\"sv)","u8\"text\"",
             (object *)(local_78 + 0x10),(char8_t (*) [5])0x46c666);
  std::__detail::__variant::
  _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  ::~_Variant_storage((_Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                       *)(local_78 + 0x10));
  inout_read_view = extraout_RDX;
  if (local_c0[0] == (internal)0x0) {
    testing::Message::Message((Message *)(local_78 + 0x10));
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_b8._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_b8._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/parsers/json.cpp"
               ,0x81,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)local_78,(Message *)(local_78 + 0x10));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_78);
    inout_read_view = extraout_RDX_00;
    if (local_68._M_u._M_first._M_storage != (void *)0x0) {
      (**(code **)(*(long *)local_68._M_u._M_first._M_storage + 8))();
      inout_read_view = extraout_RDX_01;
    }
  }
  if (local_b8._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b8,local_b8._M_head_impl);
    inout_read_view = extraout_RDX_02;
  }
  local_68._M_u._M_first._M_storage = (_Uninitialized<void_*,_true>)(void *)0x0;
  local_68._M_index = 0;
  local_78._0_8_ = &DAT_00000006;
  local_78._8_8_ = (long)"u8\"text\"" + 2;
  bVar1 = jessilib::deserialize_json<char8_t,_true,_&jessilib::fail_action>
                    ((jessilib *)(local_78 + 0x10),(object *)local_78,inout_read_view);
  local_90[0] = bVar1;
  local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar1) {
    testing::Message::Message((Message *)local_a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_c0,local_90,"deserialize_json(obj, u8text)","false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/parsers/json.cpp"
               ,0x85,(char *)CONCAT71(local_c0._1_7_,local_c0[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)local_d0,(Message *)local_a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_d0);
    if ((long *)CONCAT71(local_c0._1_7_,local_c0[0]) != local_b0) {
      operator_delete((long *)CONCAT71(local_c0._1_7_,local_c0[0]),local_b0[0] + 1);
    }
    if (local_a0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_a0 + 8))();
    }
    if (local_88 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_88,local_88);
    }
  }
  local_90 = (undefined1  [8])&DAT_00000004;
  local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x46c666;
  testing::internal::
  CmpHelperEQ<jessilib::object,std::basic_string_view<char8_t,std::char_traits<char8_t>>>
            ((internal *)local_c0,"obj","u8\"text\"sv",(object *)(local_78 + 0x10),
             (basic_string_view<char8_t,_std::char_traits<char8_t>_> *)local_90);
  if (local_c0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_90);
    if (local_b8._M_head_impl ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_b8._M_head_impl)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/parsers/json.cpp"
               ,0x86,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_a0,(Message *)local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_a0);
    if (local_90 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_90 + 8))();
    }
  }
  if (local_b8._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b8,local_b8._M_head_impl);
  }
  local_90[0] = (void *)local_78._0_8_ == (void *)0x0;
  local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((void *)local_78._0_8_ != (void *)0x0) {
    testing::Message::Message((Message *)local_a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_c0,local_90,"u8text.empty()","false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/parsers/json.cpp"
               ,0x87,(char *)CONCAT71(local_c0._1_7_,local_c0[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)local_d0,(Message *)local_a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_d0);
    if ((long *)CONCAT71(local_c0._1_7_,local_c0[0]) != local_b0) {
      operator_delete((long *)CONCAT71(local_c0._1_7_,local_c0[0]),local_b0[0] + 1);
    }
    if (local_a0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_a0 + 8))();
    }
    if (local_88 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_88,local_88);
    }
  }
  local_90 = (undefined1  [8])0x6;
  local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x46cbee;
  bVar1 = jessilib::deserialize_json<char16_t,_true,_&jessilib::fail_action>
                    ((object *)(local_78 + 0x10),
                     (basic_string_view<char16_t,_std::char_traits<char16_t>_> *)local_90);
  local_a0[0] = bVar1;
  local_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar1) {
    testing::Message::Message((Message *)local_d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_c0,local_a0,"deserialize_json(obj, u16text)","false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/parsers/json.cpp"
               ,0x8a,(char *)CONCAT71(local_c0._1_7_,local_c0[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_d8,(Message *)local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d8);
    if ((long *)CONCAT71(local_c0._1_7_,local_c0[0]) != local_b0) {
      operator_delete((long *)CONCAT71(local_c0._1_7_,local_c0[0]),local_b0[0] + 1);
    }
    if (local_d0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_d0 + 8))();
    }
    if (local_98 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_98,local_98);
    }
  }
  local_a0 = (undefined1  [8])&DAT_00000004;
  local_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x46c666;
  testing::internal::
  CmpHelperEQ<jessilib::object,std::basic_string_view<char8_t,std::char_traits<char8_t>>>
            ((internal *)local_c0,"obj","u8\"text\"sv",(object *)(local_78 + 0x10),
             (basic_string_view<char8_t,_std::char_traits<char8_t>_> *)local_a0);
  if (local_c0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_a0);
    if (local_b8._M_head_impl ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_b8._M_head_impl)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/parsers/json.cpp"
               ,0x8b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_d0,(Message *)local_a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_d0);
    if (local_a0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_a0 + 8))();
    }
  }
  if (local_b8._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b8,local_b8._M_head_impl);
  }
  local_a0[0] = local_90 == (undefined1  [8])0x0;
  local_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_90 != (undefined1  [8])0x0) {
    testing::Message::Message((Message *)local_d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_c0,local_a0,"u16text.empty()","false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/parsers/json.cpp"
               ,0x8c,(char *)CONCAT71(local_c0._1_7_,local_c0[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_d8,(Message *)local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d8);
    if ((long *)CONCAT71(local_c0._1_7_,local_c0[0]) != local_b0) {
      operator_delete((long *)CONCAT71(local_c0._1_7_,local_c0[0]),local_b0[0] + 1);
    }
    if (local_d0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_d0 + 8))();
    }
    if (local_98 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_98,local_98);
    }
  }
  local_a0 = (undefined1  [8])0x6;
  local_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x46cc14;
  bVar1 = jessilib::deserialize_json<char32_t,_true,_&jessilib::fail_action>
                    ((object *)(local_78 + 0x10),
                     (basic_string_view<char32_t,_std::char_traits<char32_t>_> *)local_a0);
  local_d0[0] = bVar1;
  local_c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar1) {
    testing::Message::Message((Message *)&local_d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_c0,local_d0,"deserialize_json(obj, u32text)","false");
    testing::internal::AssertHelper::AssertHelper
              (local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/parsers/json.cpp"
               ,0x8f,(char *)CONCAT71(local_c0._1_7_,local_c0[0]));
    testing::internal::AssertHelper::operator=(local_80,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper(local_80);
    if ((long *)CONCAT71(local_c0._1_7_,local_c0[0]) != local_b0) {
      operator_delete((long *)CONCAT71(local_c0._1_7_,local_c0[0]),local_b0[0] + 1);
    }
    if (local_d8 != (long *)0x0) {
      (**(code **)(*local_d8 + 8))();
    }
    if (local_c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_c8,local_c8);
    }
  }
  local_d0 = (undefined1  [8])&DAT_00000004;
  local_c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x46c666;
  testing::internal::
  CmpHelperEQ<jessilib::object,std::basic_string_view<char8_t,std::char_traits<char8_t>>>
            ((internal *)local_c0,"obj","u8\"text\"sv",(object *)(local_78 + 0x10),
             (basic_string_view<char8_t,_std::char_traits<char8_t>_> *)local_d0);
  if (local_c0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_d0);
    if (local_b8._M_head_impl ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_b8._M_head_impl)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/parsers/json.cpp"
               ,0x90,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_d8,(Message *)local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d8);
    if (local_d0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_d0 + 8))();
    }
  }
  if ((_Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       )local_b8._M_head_impl !=
      (_Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       )0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b8,local_b8._M_head_impl);
  }
  local_d0[0] = local_a0 == (undefined1  [8])0x0;
  local_c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_a0 != (undefined1  [8])0x0) {
    testing::Message::Message((Message *)&local_d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_c0,local_d0,"u32text.empty()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/parsers/json.cpp"
               ,0x91,(char *)CONCAT71(local_c0._1_7_,local_c0[0]));
    testing::internal::AssertHelper::operator=(local_80,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper(local_80);
    if ((long *)CONCAT71(local_c0._1_7_,local_c0[0]) != local_b0) {
      operator_delete((long *)CONCAT71(local_c0._1_7_,local_c0[0]),local_b0[0] + 1);
    }
    if (local_d8 != (long *)0x0) {
      (**(code **)(*local_d8 + 8))();
    }
    if (local_c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_c8,local_c8);
    }
  }
  std::__detail::__variant::
  _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  ::~_Variant_storage((_Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                       *)(local_78 + 0x10));
  return;
}

Assistant:

TEST(JsonParser, serialize_boolean) {
	json_parser parser;

	EXPECT_EQ(parser.serialize<char8_t>(true), u8"true");
	EXPECT_EQ(parser.serialize<char8_t>(false), u8"false");
}